

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_8dc4::ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test::TestBody
          (ARTKeyEncodeDecodeTest_AppendSpanConstByteC0001_Test *this)

{
  undefined8 in_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  __extent_storage<18446744073709551615UL> extraout_RDX_04;
  __extent_storage<18446744073709551615UL> extraout_RDX_05;
  span<const_std::byte,_18446744073709551615UL> a;
  span<const_std::byte,_18446744073709551615UL> a_00;
  span<const_std::byte,_18446744073709551615UL> a_01;
  span<const_std::byte,_18446744073709551615UL> a_02;
  span<const_std::byte,_18446744073709551615UL> a_03;
  span<const_std::byte,_18446744073709551615UL> a_04;
  span<const_std::byte,_18446744073709551615UL> a_05;
  span<const_std::byte,_18446744073709551615UL> a_06;
  undefined2 local_50;
  undefined1 local_4e;
  undefined2 local_4c;
  undefined1 local_4a;
  array<const_std::byte,_3UL> test_data_0;
  array<const_std::byte,_3UL> test_data_1;
  array<const_std::byte,_3UL> test_data_2;
  array<const_std::byte,_3UL> test_data_3;
  array<const_std::byte,_3UL> test_data_4;
  array<const_std::byte,_3UL> test_data_5;
  array<const_std::byte,_3UL> test_data_6;
  array<const_std::byte,_3UL> test_data_7;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  
  local_4e = 5;
  local_50 = 0x502;
  local_4a = 5;
  local_4c = 3;
  a._M_extent._M_extent_value._1_7_ = (undefined7)((ulong)in_RDX >> 8);
  a._M_extent._M_extent_value._0_1_ = 0x10;
  test_data_0._M_elems[2] = 0x10;
  test_data_0._M_elems[0] = 3;
  test_data_0._M_elems[1] = 0;
  test_data_1._M_elems[2] = 5;
  test_data_1._M_elems[0] = 3;
  test_data_1._M_elems[1] = 5;
  test_data_2._M_elems[2] = 0x10;
  test_data_2._M_elems[0] = 3;
  test_data_2._M_elems[1] = 5;
  test_data_3._M_elems[2] = 5;
  test_data_3._M_elems[0] = 3;
  test_data_3._M_elems[1] = 0x10;
  test_data_4._M_elems[2] = 0x10;
  test_data_4._M_elems[0] = 4;
  test_data_4._M_elems[1] = 5;
  test_data_5._M_elems[2] = 5;
  test_data_5._M_elems[0] = 4;
  test_data_5._M_elems[1] = 0x10;
  a._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&local_50,a);
  a_00._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  a_00._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&local_4c,a_00);
  a_01._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
  a_01._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&test_data_0,a_01);
  a_02._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  a_02._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&test_data_1,a_02);
  a_03._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
  a_03._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&test_data_2,a_03);
  a_04._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
  a_04._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&test_data_3,a_04);
  a_05._M_extent._M_extent_value = extraout_RDX_04._M_extent_value;
  a_05._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&test_data_4,a_05);
  a_06._M_extent._M_extent_value = extraout_RDX_05._M_extent_value;
  a_06._M_ptr = (pointer)0x3;
  do_encode_bytes_test((anon_unknown_dwarf_8dc4 *)&test_data_5,a_06);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, AppendSpanConstByteC0001) {
  constexpr auto test_data_0 = std::array<const std::byte, 3>{
      std::byte{0x02}, std::byte{0x05}, std::byte{0x05}};
  constexpr auto test_data_1 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x00}, std::byte{0x05}};
  constexpr auto test_data_2 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x00}, std::byte{0x10}};
  constexpr auto test_data_3 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x05}, std::byte{0x05}};
  constexpr auto test_data_4 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x05}, std::byte{0x10}};
  constexpr auto test_data_5 = std::array<const std::byte, 3>{
      std::byte{0x03}, std::byte{0x10}, std::byte{0x05}};
  constexpr auto test_data_6 = std::array<const std::byte, 3>{
      std::byte{0x04}, std::byte{0x05}, std::byte{0x10}};
  constexpr auto test_data_7 = std::array<const std::byte, 3>{
      std::byte{0x04}, std::byte{0x10}, std::byte{0x05}};

  do_encode_bytes_test(std::span<const std::byte>(test_data_0));
  do_encode_bytes_test(std::span<const std::byte>(test_data_1));
  do_encode_bytes_test(std::span<const std::byte>(test_data_2));
  do_encode_bytes_test(std::span<const std::byte>(test_data_3));
  do_encode_bytes_test(std::span<const std::byte>(test_data_4));
  do_encode_bytes_test(std::span<const std::byte>(test_data_5));
  do_encode_bytes_test(std::span<const std::byte>(test_data_6));
  do_encode_bytes_test(std::span<const std::byte>(test_data_7));
}